

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_clear_mergetree(filemgr *file)

{
  avl_node *paVar1;
  long in_RDI;
  stale_data *entry;
  avl_node *a;
  avl_node *in_stack_00000018;
  avl_tree *in_stack_00000020;
  avl_node *local_10;
  
  local_10 = avl_first((avl_tree *)(in_RDI + 0x298));
  while (local_10 != (avl_node *)0x0) {
    paVar1 = local_10 + -1;
    local_10 = avl_next(local_10);
    avl_remove(in_stack_00000020,in_stack_00000018);
    free(&paVar1->left);
  }
  return;
}

Assistant:

void filemgr_clear_mergetree(struct filemgr *file)
{
    struct avl_node *a;
    struct stale_data *entry;

    a = avl_first(&file->mergetree);
    while (a) {
        entry = _get_entry(a, struct stale_data, avl);
        a = avl_next(&entry->avl);
        avl_remove(&file->mergetree, &entry->avl);
        free(entry);
    }
}